

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::buildInput((anonymous_namespace)::BuildContext&,llbuild::ninja::Node*)::
NinjaInputTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  bool bVar1;
  string *path;
  BuildValue *local_238;
  BuildValue local_228;
  ValueType local_1c8;
  BuildValue local_1b0;
  ValueType local_150;
  undefined1 local_138 [8];
  FileInfo outputInfo;
  BuildValue local_98;
  ValueType local_38;
  void *local_20;
  NinjaInputTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (NinjaInputTask *)ti.impl;
  local_20 = this;
  if ((*(byte *)(*(long *)((long)this + 8) + 0x91) & 1) == 0) {
    path = llbuild::ninja::Node::getCanonicalPath_abi_cxx11_(*(Node **)((long)this + 0x10));
    llbuild::basic::FileInfo::getInfoForPath((FileInfo *)local_138,path,false);
    bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_138);
    if (bVar1) {
      anon_unknown.dwarf_83ee8::BuildValue::makeMissingInput();
      anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_150,&local_1b0);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_150,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_150);
      anon_unknown.dwarf_83ee8::BuildValue::~BuildValue(&local_1b0);
    }
    else {
      anon_unknown.dwarf_83ee8::BuildValue::makeExistingInput(&local_228,(FileInfo *)local_138);
      anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_1c8,&local_228);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_1c8,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1c8);
      anon_unknown.dwarf_83ee8::BuildValue::~BuildValue(&local_228);
    }
  }
  else {
    outputInfo.checksum.bytes[0x18] = '\0';
    outputInfo.checksum.bytes[0x19] = '\0';
    outputInfo.checksum.bytes[0x1a] = '\0';
    outputInfo.checksum.bytes[0x1b] = '\0';
    outputInfo.checksum.bytes[0x1c] = '\0';
    outputInfo.checksum.bytes[0x1d] = '\0';
    outputInfo.checksum.bytes[0x1e] = '\0';
    outputInfo.checksum.bytes[0x1f] = '\0';
    local_238 = (BuildValue *)&stack0xffffffffffffff49;
    do {
      *(undefined1 *)&local_238->kind = ExistingInput;
      local_238 = (BuildValue *)((long)&local_238->kind + 1);
    } while (local_238 != &local_98);
    anon_unknown.dwarf_83ee8::BuildValue::makeExistingInput
              (&local_98,(FileInfo *)(outputInfo.checksum.bytes + 0x18));
    anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_38,&local_98);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
    anon_unknown.dwarf_83ee8::BuildValue::~BuildValue(&local_98);
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      if (context.simulate) {
        ti.complete(BuildValue::makeExistingInput({}).toValue());
        return;
      }

      auto outputInfo = FileInfo::getInfoForPath(node->getCanonicalPath());
      if (outputInfo.isMissing()) {
        ti.complete(BuildValue::makeMissingInput().toValue());
        return;
      }

      ti.complete(BuildValue::makeExistingInput(outputInfo).toValue());
    }